

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CCtx_params *
ZSTD_assignParamsToCCtxParams
          (ZSTD_CCtx_params *__return_storage_ptr__,ZSTD_CCtx_params *cctxParams,
          ZSTD_parameters *params)

{
  ZSTD_compressionParameters cParams;
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  undefined4 in_stack_ffffffffffffffb4;
  ZSTD_strategy ZVar8;
  undefined4 uStack_44;
  ZSTD_parameters *params_local;
  ZSTD_CCtx_params *cctxParams_local;
  
  ZVar8 = (ZSTD_strategy)__return_storage_ptr__;
  uStack_44 = (undefined4)((ulong)__return_storage_ptr__ >> 0x20);
  memcpy(__return_storage_ptr__,cctxParams,0x90);
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).minMatch;
  uVar5 = (params->cParams).targetLength;
  uVar6 = (params->cParams).strategy;
  cParams.minMatch = uVar6;
  cParams.searchLog = uVar5;
  cParams.hashLog = uVar4;
  cParams.chainLog = uVar3;
  cParams.windowLog = uVar2;
  cParams.targetLength = in_stack_ffffffffffffffb4;
  cParams.strategy = ZVar8;
  sVar7 = ZSTD_checkCParams(cParams);
  if (sVar7 != 0) {
    __assert_fail("!ZSTD_checkCParams(params->cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2b4d,
                  "ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(const ZSTD_CCtx_params *, const ZSTD_parameters *)"
                 );
  }
  lVar1 = CONCAT44(uStack_44,ZVar8);
  *(undefined8 *)(lVar1 + 4) = *(undefined8 *)&params->cParams;
  *(undefined8 *)(lVar1 + 0xc) = *(undefined8 *)&(params->cParams).hashLog;
  *(undefined8 *)(lVar1 + 0x14) = *(undefined8 *)&(params->cParams).minMatch;
  *(ZSTD_strategy *)(lVar1 + 0x1c) = (params->cParams).strategy;
  *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)&params->fParams;
  *(int *)(lVar1 + 0x28) = (params->fParams).noDictIDFlag;
  *(undefined4 *)(lVar1 + 0x2c) = 3;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(
        const ZSTD_CCtx_params* cctxParams, const ZSTD_parameters* params)
{
    ZSTD_CCtx_params ret = *cctxParams;
    assert(!ZSTD_checkCParams(params->cParams));
    ret.cParams = params->cParams;
    ret.fParams = params->fParams;
    ret.compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    return ret;
}